

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_1::ToCamelCase(string *input,bool lower_first)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  byte in_DL;
  ulong in_RSI;
  string *in_RDI;
  int i;
  bool capitalize_next;
  string *result;
  int local_28;
  byte local_12;
  
  local_12 = ~(in_DL & 1) & 1;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_28 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_28 < uVar2;
      local_28 = local_28 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    if (*pcVar3 == '_') {
      local_12 = 1;
    }
    else if (local_12 == 0) {
      std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::push_back((char)in_RDI);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      ToUpper(*pcVar3);
      std::__cxx11::string::push_back((char)in_RDI);
      local_12 = 0;
    }
  }
  if (((in_DL & 1) != 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    cVar1 = ToLower(*pcVar3);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pcVar3 = cVar1;
  }
  return in_RDI;
}

Assistant:

std::string ToCamelCase(const std::string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLower(result[0]);
  }

  return result;
}